

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::createOpConstantCompositeTests(TestContext *testCtx)

{
  string *psVar1;
  NameConstantsCode *pNVar2;
  long lVar3;
  TestCaseGroup *pTVar4;
  mapped_type *pmVar5;
  NameConstantsCode *local_5d0;
  RGBA *local_448;
  RGBA *local_430;
  string local_420;
  allocator<char> local_3f9;
  key_type local_3f8;
  allocator<char> local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  allocator<char> local_369;
  key_type local_368;
  undefined1 local_348 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  size_t testNdx;
  RGBA local_308;
  RGBA local_304;
  RGBA local_300;
  undefined1 local_2fa;
  undefined1 local_2f9;
  undefined1 local_2f8;
  allocator<char> local_2f7;
  allocator<char> local_2f6;
  allocator<char> local_2f5;
  undefined1 local_2f4;
  undefined1 local_2f3;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  allocator<char> local_2f0;
  undefined1 local_2ef;
  undefined1 local_2ee;
  allocator<char> local_2ed;
  allocator<char> local_2ec;
  allocator<char> local_2eb;
  undefined1 local_2ea;
  undefined1 local_2e9;
  allocator<char> local_2e8;
  allocator<char> local_2e7;
  allocator<char> local_2e6;
  undefined1 local_2e5;
  undefined1 local_2e4;
  allocator<char> local_2e3;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  string *local_2e0;
  undefined1 local_2d8 [8];
  NameConstantsCode tests [5];
  char functionEnd [48];
  char functionStart [108];
  RGBA outputColors [4];
  RGBA inputColors [4];
  undefined1 local_28 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> opConstantCompositeTests;
  TestContext *testCtx_local;
  
  opConstantCompositeTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)
                    opConstantCompositeTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"opconstantcomposite","OpConstantComposite instruction");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&inputColors[2].m_value + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28,pTVar4
            );
  local_430 = outputColors + 2;
  do {
    tcu::RGBA::RGBA(local_430);
    local_430 = local_430 + 1;
  } while (local_430 != inputColors + 2);
  local_448 = (RGBA *)(functionStart + 0x68);
  do {
    tcu::RGBA::RGBA(local_448);
    local_448 = local_448 + 1;
  } while (local_448 != outputColors + 2);
  builtin_strncpy(functionStart + 0x58," = OpLabel\n",0xc);
  builtin_strncpy(functionStart + 0x48,"r %v4f32\n%lbl   ",0x10);
  builtin_strncpy(functionStart + 0x38,"FunctionParamete",0x10);
  builtin_strncpy(functionStart + 0x28,"ion\n%param1 = Op",0x10);
  builtin_strncpy(functionStart + 0x18,"one %v4f32_funct",0x10);
  builtin_strncpy(functionStart + 8,"unction %v4f32 N",0x10);
  builtin_strncpy(functionEnd + 0x28,"%test_co",8);
  builtin_strncpy(functionStart,"de = OpF",8);
  builtin_strncpy(functionEnd + 0x18,"\nOpFunctionEnd\n",0x10);
  builtin_strncpy(functionEnd + 8,"ransformed_param",0x10);
  tests[4].code.field_2._8_1_ = 'O';
  tests[4].code.field_2._9_1_ = 'p';
  tests[4].code.field_2._10_1_ = 'R';
  tests[4].code.field_2._11_1_ = 'e';
  tests[4].code.field_2._12_1_ = 't';
  tests[4].code.field_2._13_1_ = 'u';
  tests[4].code.field_2._14_1_ = 'r';
  tests[4].code.field_2._15_1_ = 'n';
  builtin_strncpy(functionEnd,"Value %t",8);
  local_2fa = 1;
  local_2e0 = (string *)local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2d8,"vec4",&local_2e1);
  local_2e5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[0].name.field_2._M_local_buf + 8),
             "%cval              = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_0\n"
             ,&local_2e2);
  local_2e4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[0].constants.field_2._M_local_buf + 8),
             "%transformed_param = OpFAdd %v4f32 %param1 %cval\n",&local_2e3);
  local_2e4 = 0;
  local_2e5 = 0;
  psVar1 = (string *)(tests[0].code.field_2._M_local_buf + 8);
  local_2e0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"struct",&local_2e6);
  local_2ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[1].name.field_2._M_local_buf + 8),
             "%stype             = OpTypeStruct %v4f32 %f32\n%fp_stype          = OpTypePointer Function %stype\n%f32_n_1           = OpConstant %f32 -1.0\n%f32_1_5           = OpConstant %f32 !0x3fc00000\n%cvec              = OpConstantComposite %v4f32 %f32_1_5 %f32_1_5 %f32_1_5 %c_f32_1\n%cval              = OpConstantComposite %stype %cvec %f32_n_1\n"
             ,&local_2e7);
  local_2e9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[1].constants.field_2._M_local_buf + 8),
             "%v                 = OpVariable %fp_stype Function %cval\n%vec_ptr           = OpAccessChain %fp_v4f32 %v %c_u32_0\n%f32_ptr           = OpAccessChain %fp_f32 %v %c_u32_1\n%vec_val           = OpLoad %v4f32 %vec_ptr\n%f32_val           = OpLoad %f32 %f32_ptr\n%tmp1              = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_1 %f32_val\n%tmp2              = OpFAdd %v4f32 %tmp1 %param1\n%transformed_param = OpFAdd %v4f32 %tmp2 %vec_val\n"
             ,&local_2e8);
  local_2e9 = 0;
  local_2ea = 0;
  psVar1 = (string *)(tests[1].code.field_2._M_local_buf + 8);
  local_2e0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"matrix",&local_2eb);
  local_2ef = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[2].name.field_2._M_local_buf + 8),
             "%mat4x4_f32          = OpTypeMatrix %v4f32 4\n%v4f32_1_0_0_0       = OpConstantComposite %v4f32 %c_f32_1 %c_f32_0 %c_f32_0 %c_f32_0\n%v4f32_0_1_0_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_1 %c_f32_0 %c_f32_0\n%v4f32_0_0_1_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_0 %c_f32_1 %c_f32_0\n%v4f32_0_5_0_5_0_5_1 = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_1\n%cval                = OpConstantComposite %mat4x4_f32 %v4f32_1_0_0_0 %v4f32_0_1_0_0 %v4f32_0_0_1_0 %v4f32_0_5_0_5_0_5_1\n"
             ,&local_2ec);
  local_2ee = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[2].constants.field_2._M_local_buf + 8),
             "%transformed_param   = OpMatrixTimesVector %v4f32 %cval %param1\n",&local_2ed);
  local_2ee = 0;
  local_2ef = 0;
  psVar1 = (string *)(tests[2].code.field_2._M_local_buf + 8);
  local_2e0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"array",&local_2f0);
  local_2f4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[3].name.field_2._M_local_buf + 8),
             "%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n%fp_a4f32            = OpTypePointer Function %a4f32\n%f32_n_1             = OpConstant %f32 -1.0\n%f32_1_5             = OpConstant %f32 !0x3fc00000\n%carr                = OpConstantComposite %a4f32 %c_f32_0 %f32_n_1 %f32_1_5 %c_f32_0\n"
             ,&local_2f1);
  local_2f3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[3].constants.field_2._M_local_buf + 8),
             "%v                   = OpVariable %fp_a4f32 Function %carr\n%f                   = OpAccessChain %fp_f32 %v %c_u32_0\n%f1                  = OpAccessChain %fp_f32 %v %c_u32_1\n%f2                  = OpAccessChain %fp_f32 %v %c_u32_2\n%f3                  = OpAccessChain %fp_f32 %v %c_u32_3\n%f_val               = OpLoad %f32 %f\n%f1_val              = OpLoad %f32 %f1\n%f2_val              = OpLoad %f32 %f2\n%f3_val              = OpLoad %f32 %f3\n%ftot1               = OpFAdd %f32 %f_val %f1_val\n%ftot2               = OpFAdd %f32 %ftot1 %f2_val\n%ftot3               = OpFAdd %f32 %ftot2 %f3_val\n%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %ftot3\n%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
             ,&local_2f2);
  local_2f3 = 0;
  local_2f4 = 0;
  psVar1 = (string *)(tests[3].code.field_2._M_local_buf + 8);
  local_2e0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"array_of_struct_of_array",&local_2f5);
  local_2f9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[4].name.field_2._M_local_buf + 8),
             "%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n%fp_a4f32            = OpTypePointer Function %a4f32\n%stype               = OpTypeStruct %f32 %a4f32\n%a3stype             = OpTypeArray %stype %c_u32_3\n%fp_a3stype          = OpTypePointer Function %a3stype\n%ca4f32_0            = OpConstantComposite %a4f32 %c_f32_0 %c_f32_0_5 %c_f32_0 %c_f32_0\n%ca4f32_1            = OpConstantComposite %a4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_1\n%cstype1             = OpConstantComposite %stype %c_f32_0 %ca4f32_1\n%cstype2             = OpConstantComposite %stype %c_f32_1 %ca4f32_0\n%carr                = OpConstantComposite %a3stype %cstype1 %cstype2 %cstype1"
             ,&local_2f6);
  local_2f8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[4].constants.field_2._M_local_buf + 8),
             "%v                   = OpVariable %fp_a3stype Function %carr\n%f                   = OpAccessChain %fp_f32 %v %c_u32_1 %c_u32_1 %c_u32_1\n%f_l                 = OpLoad %f32 %f\n%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %f_l\n%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
             ,&local_2f7);
  local_2f8 = 0;
  local_2f9 = 0;
  local_2fa = 0;
  std::allocator<char>::~allocator(&local_2f7);
  std::allocator<char>::~allocator(&local_2f6);
  std::allocator<char>::~allocator(&local_2f5);
  std::allocator<char>::~allocator(&local_2f2);
  std::allocator<char>::~allocator(&local_2f1);
  std::allocator<char>::~allocator(&local_2f0);
  std::allocator<char>::~allocator(&local_2ed);
  std::allocator<char>::~allocator(&local_2ec);
  std::allocator<char>::~allocator(&local_2eb);
  std::allocator<char>::~allocator(&local_2e8);
  std::allocator<char>::~allocator(&local_2e7);
  std::allocator<char>::~allocator(&local_2e6);
  std::allocator<char>::~allocator(&local_2e3);
  std::allocator<char>::~allocator(&local_2e2);
  std::allocator<char>::~allocator(&local_2e1);
  getHalfColorsFullAlpha((RGBA (*) [4])(outputColors + 2));
  tcu::RGBA::RGBA(&local_300,0xff,0xff,0xff,0xff);
  functionStart[0x68] = (undefined1)local_300.m_value;
  functionStart[0x69] = local_300.m_value._1_1_;
  functionStart[0x6a] = local_300.m_value._2_1_;
  functionStart[0x6b] = local_300.m_value._3_1_;
  tcu::RGBA::RGBA(&local_304,0xff,0x7f,0x7f,0xff);
  tcu::RGBA::RGBA(&local_308,0x7f,0xff,0x7f,0xff);
  outputColors[0].m_value = local_308.m_value;
  tcu::RGBA::RGBA((RGBA *)((long)&testNdx + 4),0x7f,0x7f,0xff,0xff);
  outputColors[1].m_value = testNdx._4_4_;
  for (fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fragments._M_t._M_impl.super__Rb_tree_header._M_node_count < 5;
      fragments._M_t._M_impl.super__Rb_tree_header._M_node_count =
           fragments._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_348);
    pNVar2 = tests + fragments._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"pre_main",&local_369);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_348,&local_368);
    std::__cxx11::string::operator=
              ((string *)pmVar5,(string *)((pNVar2->name).field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,functionEnd + 0x28,&local_3d1);
    std::operator+(&local_3b0,&local_3d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&tests[fragments._M_t._M_impl.super__Rb_tree_header._M_node_count].
                           constants.field_2 + 8));
    std::operator+(&local_390,&local_3b0,tests[4].code.field_2._M_local_buf + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"testfun",&local_3f9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_348,&local_3f8);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    lVar3 = fragments._M_t._M_impl.super__Rb_tree_header._M_node_count - 1;
    pTVar4 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28
                );
    std::__cxx11::string::string((string *)&local_420);
    createTestsForAllStages
              ((string *)((long)&tests[lVar3].code.field_2 + 8),(RGBA (*) [4])(outputColors + 2),
               (RGBA (*) [4])(functionStart + 0x68),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_348,pTVar4,QP_TEST_RESULT_FAIL,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_348);
  }
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28)
  ;
  local_5d0 = (NameConstantsCode *)((long)&tests[4].code.field_2 + 8);
  do {
    local_5d0 = local_5d0 + -1;
    createOpConstantCompositeTests::NameConstantsCode::~NameConstantsCode(local_5d0);
  } while (local_5d0 != (NameConstantsCode *)local_2d8);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createOpConstantCompositeTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> opConstantCompositeTests		(new tcu::TestCaseGroup(testCtx, "opconstantcomposite", "OpConstantComposite instruction"));
	RGBA							inputColors[4];
	RGBA							outputColors[4];


	const char						functionStart[]	 =
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param1 = OpFunctionParameter %v4f32\n"
		"%lbl    = OpLabel\n";

	const char						functionEnd[]		=
		"OpReturnValue %transformed_param\n"
		"OpFunctionEnd\n";

	struct NameConstantsCode
	{
		string name;
		string constants;
		string code;
	};

	NameConstantsCode tests[] =
	{
		{
			"vec4",

			"%cval              = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_0\n",
			"%transformed_param = OpFAdd %v4f32 %param1 %cval\n"
		},
		{
			"struct",

			"%stype             = OpTypeStruct %v4f32 %f32\n"
			"%fp_stype          = OpTypePointer Function %stype\n"
			"%f32_n_1           = OpConstant %f32 -1.0\n"
			"%f32_1_5           = OpConstant %f32 !0x3fc00000\n" // +1.5
			"%cvec              = OpConstantComposite %v4f32 %f32_1_5 %f32_1_5 %f32_1_5 %c_f32_1\n"
			"%cval              = OpConstantComposite %stype %cvec %f32_n_1\n",

			"%v                 = OpVariable %fp_stype Function %cval\n"
			"%vec_ptr           = OpAccessChain %fp_v4f32 %v %c_u32_0\n"
			"%f32_ptr           = OpAccessChain %fp_f32 %v %c_u32_1\n"
			"%vec_val           = OpLoad %v4f32 %vec_ptr\n"
			"%f32_val           = OpLoad %f32 %f32_ptr\n"
			"%tmp1              = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_1 %f32_val\n" // vec4(-1)
			"%tmp2              = OpFAdd %v4f32 %tmp1 %param1\n" // param1 + vec4(-1)
			"%transformed_param = OpFAdd %v4f32 %tmp2 %vec_val\n" // param1 + vec4(-1) + vec4(1.5, 1.5, 1.5, 1.0)
		},
		{
			// [1|0|0|0.5] [x] = x + 0.5
			// [0|1|0|0.5] [y] = y + 0.5
			// [0|0|1|0.5] [z] = z + 0.5
			// [0|0|0|1  ] [1] = 1
			"matrix",

			"%mat4x4_f32          = OpTypeMatrix %v4f32 4\n"
		    "%v4f32_1_0_0_0       = OpConstantComposite %v4f32 %c_f32_1 %c_f32_0 %c_f32_0 %c_f32_0\n"
		    "%v4f32_0_1_0_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_1 %c_f32_0 %c_f32_0\n"
		    "%v4f32_0_0_1_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_0 %c_f32_1 %c_f32_0\n"
		    "%v4f32_0_5_0_5_0_5_1 = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_1\n"
			"%cval                = OpConstantComposite %mat4x4_f32 %v4f32_1_0_0_0 %v4f32_0_1_0_0 %v4f32_0_0_1_0 %v4f32_0_5_0_5_0_5_1\n",

			"%transformed_param   = OpMatrixTimesVector %v4f32 %cval %param1\n"
		},
		{
			"array",

			"%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
			"%fp_a4f32            = OpTypePointer Function %a4f32\n"
			"%f32_n_1             = OpConstant %f32 -1.0\n"
			"%f32_1_5             = OpConstant %f32 !0x3fc00000\n" // +1.5
			"%carr                = OpConstantComposite %a4f32 %c_f32_0 %f32_n_1 %f32_1_5 %c_f32_0\n",

			"%v                   = OpVariable %fp_a4f32 Function %carr\n"
			"%f                   = OpAccessChain %fp_f32 %v %c_u32_0\n"
			"%f1                  = OpAccessChain %fp_f32 %v %c_u32_1\n"
			"%f2                  = OpAccessChain %fp_f32 %v %c_u32_2\n"
			"%f3                  = OpAccessChain %fp_f32 %v %c_u32_3\n"
			"%f_val               = OpLoad %f32 %f\n"
			"%f1_val              = OpLoad %f32 %f1\n"
			"%f2_val              = OpLoad %f32 %f2\n"
			"%f3_val              = OpLoad %f32 %f3\n"
			"%ftot1               = OpFAdd %f32 %f_val %f1_val\n"
			"%ftot2               = OpFAdd %f32 %ftot1 %f2_val\n"
			"%ftot3               = OpFAdd %f32 %ftot2 %f3_val\n"  // 0 - 1 + 1.5 + 0
			"%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %ftot3\n"
			"%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
		},
		{
			//
			// [
			//   {
			//      0.0,
			//      [ 1.0, 1.0, 1.0, 1.0]
			//   },
			//   {
			//      1.0,
			//      [ 0.0, 0.5, 0.0, 0.0]
			//   }, //     ^^^
			//   {
			//      0.0,
			//      [ 1.0, 1.0, 1.0, 1.0]
			//   }
			// ]
			"array_of_struct_of_array",

			"%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
			"%fp_a4f32            = OpTypePointer Function %a4f32\n"
			"%stype               = OpTypeStruct %f32 %a4f32\n"
			"%a3stype             = OpTypeArray %stype %c_u32_3\n"
			"%fp_a3stype          = OpTypePointer Function %a3stype\n"
			"%ca4f32_0            = OpConstantComposite %a4f32 %c_f32_0 %c_f32_0_5 %c_f32_0 %c_f32_0\n"
			"%ca4f32_1            = OpConstantComposite %a4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_1\n"
			"%cstype1             = OpConstantComposite %stype %c_f32_0 %ca4f32_1\n"
			"%cstype2             = OpConstantComposite %stype %c_f32_1 %ca4f32_0\n"
			"%carr                = OpConstantComposite %a3stype %cstype1 %cstype2 %cstype1",

			"%v                   = OpVariable %fp_a3stype Function %carr\n"
			"%f                   = OpAccessChain %fp_f32 %v %c_u32_1 %c_u32_1 %c_u32_1\n"
			"%f_l                 = OpLoad %f32 %f\n"
			"%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %f_l\n"
			"%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
		}
	};

	getHalfColorsFullAlpha(inputColors);
	outputColors[0] = RGBA(255, 255, 255, 255);
	outputColors[1] = RGBA(255, 127, 127, 255);
	outputColors[2] = RGBA(127, 255, 127, 255);
	outputColors[3] = RGBA(127, 127, 255, 255);

	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameConstantsCode); ++testNdx)
	{
		map<string, string> fragments;
		fragments["pre_main"] = tests[testNdx].constants;
		fragments["testfun"] = string(functionStart) + tests[testNdx].code + functionEnd;
		createTestsForAllStages(tests[testNdx].name, inputColors, outputColors, fragments, opConstantCompositeTests.get());
	}
	return opConstantCompositeTests.release();
}